

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_class.c
# Opt level: O2

constructor class_constructor(klass cls,type_id *args,size_t size)

{
  int iVar1;
  long lVar2;
  undefined8 *puVar3;
  long lVar4;
  vector pvVar5;
  constructor ctor;
  
  if (cls == (klass)0x0) {
    ctor = (constructor)0x0;
  }
  else {
    lVar2 = vector_size(cls->constructors);
    if (lVar2 == 0) {
      ctor = (constructor)0x0;
      log_write_impl_va("metacall",0x260,"class_constructor",
                        "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/reflect/source/reflect_class.c"
                        ,3,"Class %s does not have any constructor",cls->name);
    }
    else if (lVar2 == 1) {
      pvVar5 = cls->constructors;
LAB_00107a39:
      puVar3 = (undefined8 *)vector_at(pvVar5,0);
      ctor = (constructor)*puVar3;
    }
    else {
      lVar4 = 0;
      do {
        pvVar5 = cls->constructors;
        if (lVar2 == lVar4) goto LAB_00107a39;
        puVar3 = (undefined8 *)vector_at(pvVar5,lVar4);
        ctor = (constructor)*puVar3;
        iVar1 = constructor_compare(ctor,args,size);
        lVar4 = lVar4 + 1;
      } while (iVar1 != 0);
    }
  }
  return ctor;
}

Assistant:

constructor class_constructor(klass cls, type_id args[], size_t size)
{
	/* This method tries to find a valid constructor with correct types,
	* if this cannot be achieved, we return the default constructor and
	* we let the loader handle the new invokation with variadic arguments */
	if (cls == NULL)
	{
		return NULL;
	}

	size_t iterator, constructor_size = vector_size(cls->constructors);

	if (constructor_size == 0)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Class %s does not have any constructor", cls->name);
		return NULL;
	}
	else if (constructor_size == 1)
	{
		return vector_at_type(cls->constructors, 0, constructor);
	}

	for (iterator = 0; iterator < constructor_size; ++iterator)
	{
		constructor ctor = vector_at_type(cls->constructors, iterator, constructor);

		if (constructor_compare(ctor, args, size) == 0)
		{
			return ctor;
		}
	}

	/* Return default constructor if there is not a match */
	return vector_at_type(cls->constructors, 0, constructor);
}